

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O2

Kit_Node_t * Kit_GraphAppendNode(Kit_Graph_t *pGraph)

{
  Kit_Node_t *pKVar1;
  int iVar2;
  Kit_Node_t *__ptr;
  int iVar3;
  
  iVar3 = pGraph->nSize;
  __ptr = pGraph->pNodes;
  if (iVar3 == pGraph->nCap) {
    if (__ptr == (Kit_Node_t *)0x0) {
      __ptr = (Kit_Node_t *)malloc((long)iVar3 * 0x30);
      iVar2 = iVar3;
    }
    else {
      __ptr = (Kit_Node_t *)realloc(__ptr,(long)iVar3 * 0x30);
      iVar3 = pGraph->nSize;
      iVar2 = pGraph->nCap;
    }
    pGraph->pNodes = __ptr;
    pGraph->nCap = iVar2 * 2;
  }
  pGraph->nSize = iVar3 + 1;
  pKVar1 = __ptr + iVar3;
  pKVar1->eEdge0 = (Kit_Edge_t)0x0;
  pKVar1->eEdge1 = (Kit_Edge_t)0x0;
  (pKVar1->field_2).pFunc = (void *)0x0;
  *(undefined8 *)&__ptr[iVar3].field_0x10 = 0;
  return __ptr + iVar3;
}

Assistant:

Kit_Node_t * Kit_GraphAppendNode( Kit_Graph_t * pGraph )   
{
    Kit_Node_t * pNode;
    if ( pGraph->nSize == pGraph->nCap )
    {
        pGraph->pNodes = ABC_REALLOC( Kit_Node_t, pGraph->pNodes, 2 * pGraph->nCap ); 
        pGraph->nCap   = 2 * pGraph->nCap;
    }
    pNode = pGraph->pNodes + pGraph->nSize++;
    memset( pNode, 0, sizeof(Kit_Node_t) );
    return pNode;
}